

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool anti_aliased)

{
  uint uVar1;
  ImVec2 IVar2;
  ImDrawVert *pIVar3;
  ImVec2 IVar4;
  long lVar5;
  ImDrawIdx *pIVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ImDrawIdx IVar12;
  ulong uVar13;
  ImDrawIdx IVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  ulong local_68;
  ImVec2 local_60;
  undefined1 *local_58;
  ulong local_50;
  ulong local_48;
  float local_3c;
  ImU32 local_38;
  uint local_34;
  
  uVar11 = (ulong)(uint)points_count;
  IVar2 = GImGui->FontTexUvWhitePixel;
  if ((GImGui->Style).AntiAliasedShapes == false || !anti_aliased) {
    uStack_80 = 0x187a9a;
    PrimReserve(this,points_count * 3 + -6,points_count);
    if (0 < points_count) {
      uVar9 = 0;
      do {
        this->_VtxWritePtr->pos = points[uVar9];
        this->_VtxWritePtr->uv = IVar2;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = col;
        this->_VtxWritePtr = pIVar3 + 1;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    if (2 < points_count) {
      uVar1 = this->_VtxCurrentIdx;
      pIVar6 = this->_IdxWritePtr;
      iVar8 = points_count + -2;
      iVar10 = uVar1 + 2;
      do {
        *pIVar6 = (ImDrawIdx)uVar1;
        pIVar6[1] = (ImDrawIdx)iVar10 - 1;
        pIVar6[2] = (ImDrawIdx)iVar10;
        pIVar6 = pIVar6 + 3;
        iVar10 = iVar10 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      this->_IdxWritePtr = pIVar6;
    }
    local_34 = points_count & 0xffff;
  }
  else {
    local_34 = points_count * 2;
    uStack_80 = 0x1877f3;
    PrimReserve(this,points_count * 9 + -6,local_34);
    uVar1 = this->_VtxCurrentIdx;
    local_48 = (ulong)uVar1;
    if (2 < points_count) {
      pIVar6 = this->_IdxWritePtr;
      iVar8 = points_count + -2;
      iVar10 = uVar1 + 2;
      do {
        *pIVar6 = (ImDrawIdx)uVar1;
        pIVar6[1] = (ImDrawIdx)iVar10;
        iVar10 = iVar10 + 2;
        pIVar6[2] = (ImDrawIdx)iVar10;
        pIVar6 = pIVar6 + 3;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      this->_IdxWritePtr = pIVar6;
    }
    lVar5 = -((long)points_count * 8 + 0xfU & 0xfffffffffffffff0);
    local_58 = local_78 + lVar5;
    uVar9 = (ulong)(points_count - 1);
    local_60 = IVar2;
    local_50 = uVar11;
    local_38 = col;
    if (0 < points_count) {
      uVar13 = 0;
      uVar7 = uVar9;
      local_68 = uVar11;
      do {
        lVar15 = (long)(int)uVar7;
        local_78._0_4_ = points[uVar13].x - points[lVar15].x;
        local_3c = points[uVar13].y - points[lVar15].y;
        fVar16 = (float)local_78._0_4_ * (float)local_78._0_4_ + local_3c * local_3c;
        fVar17 = 1.0;
        if (0.0 < fVar16) {
          if (fVar16 < 0.0) {
            local_78 = ZEXT416((uint)local_78._0_4_);
            *(undefined8 *)(local_78 + lVar5 + -8) = 0x1878cb;
            fVar16 = sqrtf(fVar16);
            uVar11 = local_68;
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          fVar17 = 1.0 / fVar16;
        }
        *(float *)(local_58 + lVar15 * 8) = local_3c * fVar17;
        *(float *)(local_58 + lVar15 * 8 + 4) = -(float)local_78._0_4_ * fVar17;
        uVar7 = uVar13 & 0xffffffff;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    if (0 < (int)local_50) {
      uVar11 = 0;
      uVar13 = local_48 & 0xffffffff;
      do {
        fVar16 = (*(float *)(local_58 + (long)(int)uVar9 * 8) + *(float *)(local_58 + uVar11 * 8)) *
                 0.5;
        fVar17 = (*(float *)(local_58 + (long)(int)uVar9 * 8 + 4) +
                 *(float *)(local_58 + uVar11 * 8 + 4)) * 0.5;
        fVar18 = fVar16 * fVar16 + fVar17 * fVar17;
        if (1e-06 < fVar18) {
          fVar18 = 1.0 / fVar18;
          fVar19 = 100.0;
          if (fVar18 <= 100.0) {
            fVar19 = fVar18;
          }
          fVar16 = fVar16 * fVar19;
          fVar17 = fVar17 * fVar19;
        }
        IVar4.y = points[uVar11].y - fVar17 * 0.5;
        IVar4.x = points[uVar11].x - fVar16 * 0.5;
        this->_VtxWritePtr->pos = IVar4;
        this->_VtxWritePtr->uv = local_60;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = local_38;
        IVar2.y = fVar17 * 0.5 + points[uVar11].y;
        IVar2.x = fVar16 * 0.5 + points[uVar11].x;
        pIVar3[1].pos = IVar2;
        this->_VtxWritePtr[1].uv = local_60;
        pIVar3 = this->_VtxWritePtr;
        pIVar3[1].col = local_38 & 0xffffff;
        this->_VtxWritePtr = pIVar3 + 2;
        pIVar6 = this->_IdxWritePtr;
        IVar12 = (ImDrawIdx)uVar13;
        *pIVar6 = IVar12;
        pIVar6[1] = (short)local_48 + (short)uVar9 * 2;
        IVar14 = (short)local_48 + 1 + (short)uVar9 * 2;
        pIVar6[2] = IVar14;
        pIVar6[3] = IVar14;
        pIVar6[4] = IVar12 + 1;
        pIVar6[5] = IVar12;
        this->_IdxWritePtr = pIVar6 + 6;
        uVar9 = uVar11 & 0xffffffff;
        uVar11 = uVar11 + 1;
        uVar13 = (ulong)((int)uVar13 + 2);
      } while ((local_50 & 0xffffffff) != uVar11);
    }
    local_34 = local_34 & 0xfffe;
  }
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + local_34;
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col, bool anti_aliased)
{
    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    anti_aliased &= GImGui->Style.AntiAliasedShapes;
    //if (ImGui::GetIO().KeyCtrl) anti_aliased = false; // Debug

    if (anti_aliased)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            ImVec2 diff = p1 - p0;
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i0].x = diff.y;
            temp_normals[i0].y = -diff.x;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            ImVec2 dm = (n0 + n1) * 0.5f;
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f)
            {
                float scale = 1.0f / dmr2;
                if (scale > 100.0f) scale = 100.0f;
                dm *= scale;
            }
            dm *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos = (points[i1] - dm); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos = (points[i1] + dm); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}